

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

Vec4 __thiscall
tcu::Texture2DArrayView::gatherOffsets
          (Texture2DArrayView *this,Sampler *sampler,float s,float t,float r,int componentNdx,
          IVec2 (*offsets) [4])

{
  ConstPixelBufferAccess *src;
  int depth;
  undefined4 in_register_00000014;
  IVec2 (*in_R8) [4];
  Vec4 VVar1;
  IVec2 (*offsets_local) [4];
  int componentNdx_local;
  float r_local;
  float t_local;
  float s_local;
  Sampler *sampler_local;
  Texture2DArrayView *this_local;
  
  src = *(ConstPixelBufferAccess **)&sampler->wrapR;
  depth = selectLayer((Texture2DArrayView *)sampler,r);
  VVar1 = gatherArray2DOffsets
                    ((tcu *)this,src,(Sampler *)CONCAT44(in_register_00000014,componentNdx),s,t,
                     depth,(int)offsets,in_R8);
  return (Vec4)VVar1.m_data;
}

Assistant:

Vec4 Texture2DArrayView::gatherOffsets (const Sampler& sampler, float s, float t, float r, int componentNdx, const IVec2 (&offsets)[4]) const
{
	return gatherArray2DOffsets(m_levels[0], sampler, s, t, selectLayer(r), componentNdx, offsets);
}